

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O3

ErrorNumber test_func_stoch(TA_History *history)

{
  TA_RetCode TVar1;
  TA_RetCode retCode;
  ErrorNumber EVar2;
  TestId TVar3;
  ulong uVar4;
  undefined8 uVar5;
  TA_Test_conflict15 *pTVar6;
  ulong uVar7;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict15 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar6 = tableTest;
  uVar4 = 0;
  while( true ) {
    if ((int)history->nbBars < pTVar6->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
             ,uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    retCode = TA_NOT_SUPPORTED;
    if (pTVar6->optInMAType_1 == 1) {
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,pTVar6->unstablePeriod);
      retCode = TA_SUCCESS;
      if (TVar1 != TA_SUCCESS) {
        uVar7 = 0x8a;
        goto LAB_0011bbba;
      }
    }
    TVar3 = pTVar6->testId;
    if (TVar3 == TEST_STOCHRSI) {
      retCode = TA_STOCHRSI(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,pTVar6->optInPeriod_0,
                            pTVar6->optInPeriod_1,pTVar6->optInPeriod_2,pTVar6->optInMAType_2,
                            &outBegIdx,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
    }
    else if (TVar3 == TEST_STOCHF) {
      retCode = TA_STOCHF(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar6->optInPeriod_0,pTVar6->optInPeriod_1,pTVar6->optInMAType_1,
                          &outBegIdx,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
    }
    else if (TVar3 == TEST_STOCH) {
      retCode = TA_STOCH(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar6->optInPeriod_0,pTVar6->optInPeriod_1,pTVar6->optInMAType_1,
                         pTVar6->optInPeriod_2,pTVar6->optInMAType_2,&outBegIdx,&outNbElement,
                         gBuffer[0].out0,gBuffer[0].out1);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 != TA_TEST_PASS))
       || (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar2 != TA_TEST_PASS)) goto LAB_0011bb74;
    EVar2 = checkExpectedValue(gBuffer[0].out0,retCode,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    uVar5 = 0;
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[0].out1,retCode,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) {
LAB_0011bb79:
      uVar7 = (ulong)EVar2;
      uVar5 = 1;
      goto LAB_0011bbac;
    }
    outNbElement = 0;
    outBegIdx = 0;
    TVar3 = pTVar6->testId;
    if (TVar3 == TEST_STOCH) {
      retCode = referenceStoch(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,
                               gBuffer[2].in,pTVar6->optInPeriod_0,pTVar6->optInPeriod_1,
                               pTVar6->optInMAType_1,pTVar6->optInPeriod_2,pTVar6->optInMAType_2,
                               &outBegIdx,&outNbElement,gBuffer[1].out0,gBuffer[1].out1);
      EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
      if (((EVar2 == TA_TEST_PASS) &&
          (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 == TA_TEST_PASS)
          ) && (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
               EVar2 == TA_TEST_PASS)) {
        EVar2 = checkExpectedValue(gBuffer[1].out0,retCode,pTVar6->expectedRetCode,outBegIdx,
                                   pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                   pTVar6->oneOfTheExpectedOutReal0,
                                   pTVar6->oneOfTheExpectedOutRealIndex0);
        if (EVar2 != TA_TEST_PASS) goto LAB_0011bba2;
        EVar2 = checkExpectedValue(gBuffer[1].out1,retCode,pTVar6->expectedRetCode,outBegIdx,
                                   pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                   pTVar6->oneOfTheExpectedOutReal1,
                                   pTVar6->oneOfTheExpectedOutRealIndex1);
        if (EVar2 != TA_TEST_PASS) goto LAB_0011bb79;
        EVar2 = checkSameContent(gBuffer[1].out0,gBuffer[0].out0);
        if ((EVar2 == TA_TEST_PASS) &&
           (EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[0].out1), EVar2 == TA_TEST_PASS)) {
          TVar3 = pTVar6->testId;
          goto LAB_0011b96f;
        }
      }
LAB_0011bb74:
      uVar7 = (ulong)EVar2;
      goto LAB_0011bbba;
    }
LAB_0011b96f:
    if (TVar3 == TEST_STOCHRSI) {
      retCode = TA_STOCHRSI(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,pTVar6->optInPeriod_0,
                            pTVar6->optInPeriod_1,pTVar6->optInPeriod_2,pTVar6->optInMAType_2,
                            &outBegIdx,&outNbElement,gBuffer[0].in,gBuffer[1].in);
    }
    else if (TVar3 == TEST_STOCHF) {
      retCode = TA_STOCHF(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar6->optInPeriod_0,pTVar6->optInPeriod_1,pTVar6->optInMAType_1,
                          &outBegIdx,&outNbElement,gBuffer[0].in,gBuffer[1].in);
    }
    else if (TVar3 == TEST_STOCH) {
      retCode = TA_STOCH(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar6->optInPeriod_0,pTVar6->optInPeriod_1,pTVar6->optInMAType_1,
                         pTVar6->optInPeriod_2,pTVar6->optInMAType_2,&outBegIdx,&outNbElement,
                         gBuffer[0].in,gBuffer[1].in);
    }
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
    if ((EVar2 != TA_TEST_PASS) ||
       (EVar2 = checkSameContent(gBuffer[0].out1,gBuffer[1].in), EVar2 != TA_TEST_PASS))
    goto LAB_0011bb74;
    EVar2 = checkExpectedValue(gBuffer[0].in,retCode,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) {
LAB_0011bba2:
      uVar7 = (ulong)EVar2;
      uVar5 = 0;
      goto LAB_0011bbac;
    }
    EVar2 = checkExpectedValue(gBuffer[1].in,retCode,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011bb79;
    local_48 = history->high;
    pTStack_40 = history->low;
    local_38 = history->close;
    local_50 = pTVar6;
    if (((pTVar6->doRangeTestFlag != 0) && ((ulong)pTVar6->testId < 3)) &&
       (EVar2 = doRangeTest(rangeTestFunction,
                            *(TA_FuncUnstId *)(&DAT_0018789c + (ulong)pTVar6->testId * 4),&local_50,
                            2,0), EVar2 != TA_TEST_PASS)) goto LAB_0011bb74;
    uVar4 = uVar4 + 1;
    pTVar6 = pTVar6 + 1;
    if (uVar4 == 0xb) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  }
  uVar7 = (ulong)EVar2;
LAB_0011bbac:
  printf("Fail for output id=%d\n",uVar5);
LAB_0011bbba:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
         ,uVar4 & 0xffffffff,uVar7);
  return (ErrorNumber)uVar7;
}

Assistant:

ErrorNumber test_func_stoch( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}